

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

char * lyjson_convert_enumber(ly_ctx *ctx,char *number,uint num_len,char *e_ptr)

{
  uint len;
  uint uVar1;
  int *piVar2;
  long lVar3;
  size_t sVar4;
  ushort **ppuVar5;
  int iVar6;
  bool bVar7;
  uint num_len_no_e;
  int minus;
  int chars_to_dot;
  int dot_pos;
  long e_val;
  char *number_ptr;
  char *num;
  char *ptr;
  char *e_ptr_local;
  char *pcStack_20;
  uint num_len_local;
  char *number_local;
  ly_ctx *ctx_local;
  
  bVar7 = *number == '-';
  e_ptr_local._4_4_ = num_len;
  pcStack_20 = number;
  if (bVar7) {
    pcStack_20 = number + 1;
    e_ptr_local._4_4_ = num_len - 1;
  }
  len = (int)e_ptr - (int)pcStack_20;
  ptr = e_ptr;
  number_local = (char *)ctx;
  piVar2 = __errno_location();
  *piVar2 = 0;
  ptr = ptr + 1;
  lVar3 = strtol(ptr,&num,10);
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    if (num == pcStack_20 + e_ptr_local._4_4_) {
      num = strnchr(pcStack_20,0x2e,len);
      minus = len;
      if (num != (char *)0x0) {
        minus = (int)num - (int)pcStack_20;
      }
      uVar1 = minus + (int)lVar3;
      if ((int)uVar1 < 1) {
        number_ptr = (char *)malloc((ulong)((bVar7 - uVar1) + (len - (num != (char *)0x0)) + 3));
      }
      else if ((int)uVar1 < (int)len) {
        number_ptr = (char *)malloc((ulong)(bVar7 + len + (uint)(num == (char *)0x0) + 1));
      }
      else {
        iVar6 = 1;
        if (num != (char *)0x0) {
          iVar6 = 2;
        }
        number_ptr = (char *)malloc((long)(int)((uint)bVar7 + (uVar1 - iVar6) + 1));
      }
      if (number_ptr == (char *)0x0) {
        ly_log((ly_ctx *)number_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyjson_convert_enumber");
        ctx_local = (ly_ctx *)0x0;
      }
      else {
        if (bVar7) {
          strcpy(number_ptr,"-");
        }
        else {
          *number_ptr = '\0';
        }
        if ((int)uVar1 < 1) {
          strcat(number_ptr,"0.");
        }
        if ((int)uVar1 < 0) {
          sVar4 = strlen(number_ptr);
          sprintf(number_ptr + sVar4,"%0*d",(ulong)-uVar1,0);
        }
        sVar4 = strlen(number_ptr);
        num = number_ptr + sVar4;
        e_val = (long)pcStack_20;
        num_len_no_e = uVar1;
        while ((uint)((int)e_val - (int)pcStack_20) < len) {
          if (num_len_no_e == 0) {
            *num = '.';
            num = num + 1;
            num_len_no_e = 0xffffffff;
          }
          else {
            ppuVar5 = __ctype_b_loc();
            if (((*ppuVar5)[(int)*(char *)e_val] & 0x800) == 0) {
              if (*(char *)e_val != '.') {
                ly_log((ly_ctx *)number_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_json.c"
                       ,0x14f);
                free(number_ptr);
                return (char *)0x0;
              }
            }
            else {
              *num = *(char *)e_val;
              num = num + 1;
              if (0 < (int)num_len_no_e) {
                num_len_no_e = num_len_no_e - 1;
              }
            }
            e_val = e_val + 1;
          }
        }
        *num = '\0';
        if ((int)len < (int)uVar1) {
          sVar4 = strlen(number_ptr);
          sprintf(number_ptr + sVar4,"%0*d",(ulong)(uVar1 - len),0);
        }
        ctx_local = (ly_ctx *)number_ptr;
      }
    }
    else {
      ly_log((ly_ctx *)number_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_json.c"
             ,0x11a);
      ctx_local = (ly_ctx *)0x0;
    }
  }
  else {
    ly_vlog((ly_ctx *)number_local,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
            "Exponent out-of-bounds in a JSON Number value (%.*s).",
            (ulong)e_ptr_local._4_4_ - ((long)ptr - (long)pcStack_20),ptr);
    ctx_local = (ly_ctx *)0x0;
  }
  return (char *)ctx_local;
}

Assistant:

static char *
lyjson_convert_enumber(struct ly_ctx *ctx, const char *number, unsigned int num_len, char *e_ptr)
{
    char *ptr, *num;
    const char *number_ptr;
    long int e_val;
    int dot_pos, chars_to_dot, minus;
    unsigned int num_len_no_e;

    if (*number == '-') {
        minus = 1;
        ++number;
        --num_len;
    } else {
        minus = 0;
    }

    num_len_no_e = e_ptr - number;

    errno = 0;
    ++e_ptr;
    e_val = strtol(e_ptr, &ptr, 10);
    if (errno) {
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Exponent out-of-bounds in a JSON Number value (%.*s).",
               num_len - (e_ptr - number), e_ptr);
        return NULL;
    } else if (ptr != number + num_len) {
        /* we checked this already */
        LOGINT(ctx);
        return NULL;
    }

    if ((ptr = strnchr(number, '.', num_len_no_e))) {
        dot_pos = ptr - number;
    } else {
        dot_pos = num_len_no_e;
    }

    dot_pos += e_val;

    /* allocate enough memory */
    if (dot_pos < 1) {
        /* (.XXX)XXX[.]XXXX */
        num = malloc((minus ? 1 : 0) + -dot_pos + 2 + (num_len_no_e - (ptr ? 1 : 0)) + 1);
    } else if (dot_pos < (signed)num_len_no_e) {
        /* XXXX(.)XX.XXX */
        num = malloc((minus ? 1 : 0) + num_len_no_e + (ptr ? 0 : 1) + 1);
    } else {
        /* XXX[.]XXXX(XXX.) */
        num = malloc((minus ? 1 : 0) + (dot_pos - (ptr ? 2 : 1)) + 1);
    }
    LY_CHECK_ERR_RETURN(!num, LOGMEM(ctx), NULL);
    if (minus) {
        strcpy(num, "-");
    } else {
        num[0] = '\0';
    }

    if (dot_pos < 1) {
        strcat(num, "0.");
    }
    if (dot_pos < 0) {
        sprintf(num + strlen(num), "%0*d", -dot_pos, 0);
    }

    chars_to_dot = dot_pos;
    for (ptr = num + strlen(num), number_ptr = number; (unsigned)(number_ptr - number) < num_len_no_e; ) {
        if (!chars_to_dot) {
            *ptr = '.';
            ++ptr;
            chars_to_dot = -1;
        } else if (isdigit(*number_ptr)) {
            *ptr = *number_ptr;
            ++ptr;
            ++number_ptr;
            if (chars_to_dot > 0) {
                --chars_to_dot;
            }
        } else if (*number_ptr == '.') {
            ++number_ptr;
        } else {
            LOGINT(ctx);
            free(num);
            return NULL;
        }
    }
    *ptr = '\0';

    if (dot_pos > (signed)num_len_no_e) {
        sprintf(num + strlen(num), "%0*d", dot_pos - num_len_no_e, 0);
    }

    return num;
}